

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerSafe::
Petition(std::function<void(std::__cxx11::string_const*,ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)
::$_0::~__0(__0 *this)

{
  if (*(__0 **)(this + 0x28) != this + 0x38) {
    operator_delete(*(__0 **)(this + 0x28));
  }
  if (*(code **)(this + 0x18) != (code *)0x0) {
    (**(code **)(this + 0x18))(this + 8,this + 8,3);
  }
  return;
}

Assistant:

Error CommissionerSafe::Petition(std::string &aExistingCommissionerId, const std::string &aAddr, uint16_t aPort)
{
    std::promise<Error> pro;
    auto wait = [&pro, &aExistingCommissionerId](const std::string *existingCommissionerId, Error error) {
        if (existingCommissionerId != nullptr)
        {
            aExistingCommissionerId = *existingCommissionerId;
        }
        pro.set_value(error);
    };

    Petition(wait, aAddr, aPort);
    return pro.get_future().get();
}